

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O0

void put_cmyk(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  byte *pbVar1;
  undefined1 *puVar2;
  long in_RSI;
  long in_RDI;
  JSAMPLE k;
  JSAMPLE y;
  JSAMPLE m;
  JSAMPLE c;
  JSAMPLE b;
  JSAMPLE g;
  JSAMPLE r;
  JDIMENSION col;
  JSAMPROW ptr;
  char *bufferptr;
  ppm_dest_ptr dest;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  int local_54;
  byte *local_50;
  undefined1 *local_48;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  byte local_4;
  byte local_3;
  byte local_2;
  byte local_1;
  
  local_50 = (byte *)**(undefined8 **)(in_RSI + 0x28);
  local_48 = *(undefined1 **)(in_RSI + 0x38);
  for (local_54 = *(int *)(in_RDI + 0x88); local_54 != 0; local_54 = local_54 + -1) {
    local_1 = *local_50;
    local_2 = local_50[1];
    pbVar1 = local_50 + 3;
    local_3 = local_50[2];
    local_50 = local_50 + 4;
    local_4 = *pbVar1;
    local_10 = &local_55;
    local_18 = &local_56;
    local_20 = &local_57;
    *local_48 = (char)(int)(((double)local_1 * (double)local_4) / 255.0 + 0.5);
    puVar2 = local_48 + 2;
    local_48[1] = (char)(int)(((double)local_2 * (double)local_4) / 255.0 + 0.5);
    local_48 = local_48 + 3;
    *puVar2 = (char)(int)(((double)local_3 * (double)local_4) / 255.0 + 0.5);
  }
  fwrite(*(void **)(in_RSI + 0x38),1,*(size_t *)(in_RSI + 0x48),*(FILE **)(in_RSI + 0x20));
  return;
}

Assistant:

METHODDEF(void)
put_cmyk(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
         JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register JSAMPROW ptr;
  register JDIMENSION col;

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    JSAMPLE r, g, b, c = *ptr++, m = *ptr++, y = *ptr++, k = *ptr++;
    cmyk_to_rgb(c, m, y, k, &r, &g, &b);
    PUTPPMSAMPLE(bufferptr, r);
    PUTPPMSAMPLE(bufferptr, g);
    PUTPPMSAMPLE(bufferptr, b);
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}